

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

Filename * xlatlognam(Filename *src,char *hostname,int port,tm *tm)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  strbuf *buf_o;
  size_t sVar4;
  Filename *pFVar5;
  Filename *pFVar6;
  uchar local_73;
  char c_1;
  char c;
  _Bool sanitise;
  Filename *ret;
  char *s;
  strbuf *buffer;
  char **ppcStack_50;
  int size;
  char *bufp;
  char buf [32];
  tm *tm_local;
  int port_local;
  char *hostname_local;
  Filename *src_local;
  
  buf._24_8_ = tm;
  buf_o = strbuf_new();
  ret = (Filename *)filename_to_str(src);
  while (*(char *)&ret->path != '\0') {
    bVar2 = false;
    ppcStack_50 = &bufp;
    if (*(char *)&ret->path == '&') {
      pFVar5 = (Filename *)((long)&ret->path + 1);
      buffer._4_4_ = 0;
      if (*(char *)&pFVar5->path != '\0') {
        pFVar6 = (Filename *)((long)&ret->path + 2);
        bVar1 = *(byte *)&pFVar5->path;
        iVar3 = tolower((uint)bVar1);
        pFVar5 = pFVar6;
        switch(iVar3) {
        case 100:
          sVar4 = strftime((char *)&bufp,0x20,"%d",(tm *)buf._24_8_);
          buffer._4_4_ = (int)sVar4;
          break;
        default:
          bufp._0_1_ = 0x26;
          buffer._4_4_ = 1;
          if (bVar1 != 0x26) {
            buffer._4_4_ = 2;
            bufp._1_1_ = bVar1;
          }
          break;
        case 0x68:
          sVar4 = strlen(hostname);
          buffer._4_4_ = (int)sVar4;
          ppcStack_50 = (char **)hostname;
          break;
        case 0x6d:
          sVar4 = strftime((char *)&bufp,0x20,"%m",(tm *)buf._24_8_);
          buffer._4_4_ = (int)sVar4;
          break;
        case 0x70:
          buffer._4_4_ = sprintf((char *)&bufp,"%d",(ulong)(uint)port);
          break;
        case 0x74:
          sVar4 = strftime((char *)&bufp,0x20,"%H%M%S",(tm *)buf._24_8_);
          buffer._4_4_ = (int)sVar4;
          break;
        case 0x79:
          sVar4 = strftime((char *)&bufp,0x20,"%Y",(tm *)buf._24_8_);
          buffer._4_4_ = (int)sVar4;
        }
      }
      ret = pFVar5;
      bVar2 = true;
    }
    else {
      bufp._0_1_ = *(undefined1 *)&ret->path;
      buffer._4_4_ = 1;
      ret = (Filename *)((long)&ret->path + 1);
    }
    while (0 < buffer._4_4_) {
      local_73 = *(uchar *)ppcStack_50;
      if (bVar2) {
        local_73 = filename_char_sanitise(local_73);
      }
      BinarySink_put_byte(buf_o->binarysink_,local_73);
      buffer._4_4_ = buffer._4_4_ + -1;
      ppcStack_50 = (char **)((long)ppcStack_50 + 1);
    }
  }
  pFVar5 = filename_from_str(buf_o->s);
  strbuf_free(buf_o);
  return pFVar5;
}

Assistant:

static Filename *xlatlognam(Filename *src, char *hostname, int port,
                            struct tm *tm)
{
    char buf[32], *bufp;
    int size;
    strbuf *buffer;
    const char *s;
    Filename *ret;

    buffer = strbuf_new();
    s = filename_to_str(src);

    while (*s) {
        bool sanitise = false;
        /* Let (bufp, len) be the string to append. */
        bufp = buf;                    /* don't usually override this */
        if (*s == '&') {
            char c;
            s++;
            size = 0;
            if (*s) switch (c = *s++, tolower((unsigned char)c)) {
              case 'y':
                size = strftime(buf, sizeof(buf), "%Y", tm);
                break;
              case 'm':
                size = strftime(buf, sizeof(buf), "%m", tm);
                break;
              case 'd':
                size = strftime(buf, sizeof(buf), "%d", tm);
                break;
              case 't':
                size = strftime(buf, sizeof(buf), "%H%M%S", tm);
                break;
              case 'h':
                bufp = hostname;
                size = strlen(bufp);
                break;
              case 'p':
                size = sprintf(buf, "%d", port);
                break;
              default:
                buf[0] = '&';
                size = 1;
                if (c != '&')
                    buf[size++] = c;
            }
            /* Never allow path separators - or any other illegal
             * filename character - to come out of any of these
             * auto-format directives. E.g. 'hostname' can contain
             * colons, if it's an IPv6 address, and colons aren't
             * legal in filenames on Windows. */
            sanitise = true;
        } else {
            buf[0] = *s++;
            size = 1;
        }
        while (size-- > 0) {
            char c = *bufp++;
            if (sanitise)
                c = filename_char_sanitise(c);
            put_byte(buffer, c);
        }
    }

    ret = filename_from_str(buffer->s);
    strbuf_free(buffer);
    return ret;
}